

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O3

cs_err cs_option(csh ud,cs_opt_type type,size_t value)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  int *piVar5;
  int *piVar6;
  uint8_t uVar7;
  cs_err cVar8;
  ulong uVar9;
  undefined4 *puVar10;
  int *piVar11;
  cs_opt_mem *mem;
  
  if (type == CS_OPT_MEM) {
    cs_mem_malloc = *(cs_malloc_t *)value;
    cs_mem_calloc = *(cs_calloc_t *)(value + 8);
    cs_mem_realloc = *(cs_realloc_t *)(value + 0x10);
    cs_mem_free = *(cs_free_t *)(value + 0x18);
    cs_vsnprintf = *(cs_vsnprintf_t *)(value + 0x20);
    goto LAB_001c703e;
  }
  if (ud == 0) {
    return CS_ERR_CSH;
  }
  switch(type) {
  case CS_OPT_DETAIL:
    *(int *)(ud + 0x60) = (int)value;
    goto LAB_001c703e;
  case CS_OPT_MODE:
    uVar9 = (ulong)*(uint *)ud;
    cVar8 = CS_ERR_OPTION;
    if (((long)cs_arch_disallowed_mode_mask[uVar9] & value) == 0) goto LAB_001c70c9;
    break;
  default:
    uVar9 = (ulong)*(uint *)ud;
LAB_001c70c9:
    cVar8 = (*cs_arch_option[uVar9])((cs_struct *)ud,type,value);
    return cVar8;
  case CS_OPT_SKIPDATA:
    cVar8 = CS_ERR_OK;
    *(bool *)(ud + 0x80) = value == 3;
    if ((value == 3) && (*(char *)(ud + 0x81) == '\0')) {
      uVar7 = skipdata_size((cs_struct *)ud);
      *(uint8_t *)(ud + 0x81) = uVar7;
    }
    break;
  case CS_OPT_SKIPDATA_SETUP:
    cVar8 = CS_ERR_OK;
    if (value != 0) {
      *(undefined8 *)(ud + 0x98) = *(undefined8 *)(value + 0x10);
      uVar4 = *(undefined8 *)(value + 8);
      *(undefined8 *)(ud + 0x88) = *(undefined8 *)value;
      *(undefined8 *)(ud + 0x90) = uVar4;
    }
    break;
  case CS_OPT_MNEMONIC:
    iVar2 = *(int *)value;
    cVar8 = CS_ERR_OK;
    if (iVar2 != 0) {
      piVar1 = (int *)(ud + 0xb0);
      piVar11 = *(int **)(ud + 0xb0);
      if (*(char **)(value + 8) == (char *)0x0) {
        if (piVar11 != (int *)0x0) {
          iVar3 = *piVar11;
          piVar6 = piVar11;
          while (piVar5 = piVar11, iVar3 != iVar2) {
            piVar11 = *(int **)(piVar5 + 10);
            if (piVar11 == (int *)0x0) {
              return CS_ERR_OK;
            }
            iVar3 = *piVar11;
            piVar6 = piVar5;
          }
          piVar11 = piVar6 + 10;
          if (piVar5 == piVar6) {
            piVar11 = piVar1;
          }
          *(undefined8 *)piVar11 = *(undefined8 *)(piVar5 + 10);
          (*cs_mem_free)(piVar5);
        }
      }
      else {
        for (; piVar11 != (int *)0x0; piVar11 = *(int **)(piVar11 + 10)) {
          if (*piVar11 == iVar2) {
            strncpy((char *)(piVar11 + 1),*(char **)(value + 8),0x1f);
            *(undefined1 *)((long)piVar11 + 0x23) = 0;
            return CS_ERR_OK;
          }
        }
        puVar10 = (undefined4 *)(*cs_mem_malloc)(0x30);
        *puVar10 = *(undefined4 *)value;
        strncpy((char *)(puVar10 + 1),*(char **)(value + 8),0x1f);
        *(undefined1 *)((long)puVar10 + 0x23) = 0;
        *(undefined8 *)(puVar10 + 10) = *(undefined8 *)piVar1;
        *(undefined4 **)piVar1 = puVar10;
      }
    }
    break;
  case CS_OPT_UNSIGNED:
    *(int *)(ud + 100) = (int)value;
LAB_001c703e:
    cVar8 = CS_ERR_OK;
  }
  return cVar8;
}

Assistant:

CAPSTONE_API cs_option(csh ud, cs_opt_type type, size_t value)
{
	struct cs_struct *handle;
	cs_opt_mnem *opt;

	// cs_option() can be called with NULL handle just for CS_OPT_MEM
	// This is supposed to be executed before all other APIs (even cs_open())
	if (type == CS_OPT_MEM) {
		cs_opt_mem *mem = (cs_opt_mem *)value;

		cs_mem_malloc = mem->malloc;
		cs_mem_calloc = mem->calloc;
		cs_mem_realloc = mem->realloc;
		cs_mem_free = mem->free;
		cs_vsnprintf = mem->vsnprintf;

		return CS_ERR_OK;
	}

	handle = (struct cs_struct *)(uintptr_t)ud;
	if (!handle)
		return CS_ERR_CSH;

	switch(type) {
		default:
			break;

		case CS_OPT_UNSIGNED:
			handle->imm_unsigned = (cs_opt_value)value;
			return CS_ERR_OK;

		case CS_OPT_DETAIL:
			handle->detail = (cs_opt_value)value;
			return CS_ERR_OK;

		case CS_OPT_SKIPDATA:
			handle->skipdata = (value == CS_OPT_ON);
			if (handle->skipdata) {
				if (handle->skipdata_size == 0) {
					// set the default skipdata size
					handle->skipdata_size = skipdata_size(handle);
				}
			}
			return CS_ERR_OK;

		case CS_OPT_SKIPDATA_SETUP:
			if (value)
				handle->skipdata_setup = *((cs_opt_skipdata *)value);
			return CS_ERR_OK;

		case CS_OPT_MNEMONIC:
			opt = (cs_opt_mnem *)value;
			if (opt->id) {
				if (opt->mnemonic) {
					struct insn_mnem *tmp;

					// add new instruction, or replace existing instruction
					// 1. find if we already had this insn in the linked list
					tmp = handle->mnem_list;
					while(tmp) {
						if (tmp->insn.id == opt->id) {
							// found this instruction, so replace its mnemonic
							(void)strncpy(tmp->insn.mnemonic, opt->mnemonic, sizeof(tmp->insn.mnemonic) - 1);
							tmp->insn.mnemonic[sizeof(tmp->insn.mnemonic) - 1] = '\0';
							break;
						}
						tmp = tmp->next;
					}

					// 2. add this instruction if we have not had it yet
					if (!tmp) {
						tmp = cs_mem_malloc(sizeof(*tmp));
						tmp->insn.id = opt->id;
						(void)strncpy(tmp->insn.mnemonic, opt->mnemonic, sizeof(tmp->insn.mnemonic) - 1);
						tmp->insn.mnemonic[sizeof(tmp->insn.mnemonic) - 1] = '\0';
						// this new instruction is heading the list
						tmp->next = handle->mnem_list;
						handle->mnem_list = tmp;
					}
					return CS_ERR_OK;
				} else {
					struct insn_mnem *prev, *tmp;

					// we want to delete an existing instruction
					// iterate the list to find the instruction to remove it
					tmp = handle->mnem_list;
					prev = tmp;
					while(tmp) {
						if (tmp->insn.id == opt->id) {
							// delete this instruction
							if (tmp == prev) {
								// head of the list
								handle->mnem_list = tmp->next;
							} else {
								prev->next = tmp->next;
							}
							cs_mem_free(tmp);
							break;
						}
						prev = tmp;
						tmp = tmp->next;
					}
				}
			}
			return CS_ERR_OK;

		case CS_OPT_MODE:
			// verify if requested mode is valid
			if (value & cs_arch_disallowed_mode_mask[handle->arch]) {
				return CS_ERR_OPTION;
			}
			break;
	}

	return cs_arch_option[handle->arch](handle, type, value);
}